

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::detail::arg_formatter_base<fmt::v6::buffer_range<char>,fmt::v6::detail::error_handler>::
write_int<unsigned__int128>
          (arg_formatter_base<fmt::v6::buffer_range<char>,fmt::v6::detail::error_handler> *this,
          unsigned___int128 value,format_specs *spec)

{
  undefined1 value_00 [16];
  long in_RCX;
  undefined8 in_stack_ffffffffffffff48;
  undefined1 local_88 [8];
  int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128> w;
  format_specs *spec_local;
  unsigned___int128 value_local;
  arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler> *this_local;
  
  value_00._8_8_ = this;
  value_00._0_8_ = in_stack_ffffffffffffff48;
  int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char,unsigned__int128>::
  int_writer<unsigned__int128>
            ((int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char,unsigned__int128>
              *)local_88,*(buffer<char> **)this,(locale_ref)*(void **)(this + 8),
             (unsigned___int128)value_00,spec);
  handle_int_type_spec<fmt::v6::detail::int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char,unsigned__int128>&>
            (*(char *)(in_RCX + 8),
             (int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>
              *)local_88);
  *(undefined1 (*) [8])this = local_88;
  return;
}

Assistant:

void write_int(T value, const format_specs& spec) {
    using uint_type = uint32_or_64_or_128_t<T>;
    int_writer<iterator, char_type, uint_type> w(out_, locale_, value, spec);
    handle_int_type_spec(spec.type, w);
    out_ = w.out;
  }